

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr_from_callbacks(stbi_io_callbacks *clbk,void *user)

{
  int iVar1;
  stbi__context s;
  stbi_io_callbacks *in_stack_ffffffffffffff08;
  stbi__context *in_stack_ffffffffffffff10;
  
  stbi__start_callbacks(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(void *)0x29e631);
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffff10);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_callbacks(stbi_io_callbacks const *clbk, void *user)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(clbk);
   STBI_NOTUSED(user);
   return 0;
   #endif
}